

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::Destroy(AActor *this)

{
  AActor *pAVar1;
  
  ClearRenderSectorList(this);
  ClearRenderLineList(this);
  DestroyAllInventory(this);
  if ((this->tid != 0) && (this->iprev != (AActor **)0x0)) {
    pAVar1 = this->inext;
    *this->iprev = pAVar1;
    if (pAVar1 != (AActor *)0x0) {
      pAVar1->iprev = this->iprev;
    }
    this->inext = (AActor *)0x0;
    this->iprev = (AActor **)0x0;
  }
  this->tid = 0;
  UnlinkFromWorld(this);
  *(byte *)&(this->flags).Value = (byte)(this->flags).Value | 0x18;
  P_DelSector_List();
  S_RelinkSound(this,(AActor *)0x0);
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void AActor::Destroy ()
{
	ClearRenderSectorList();
	ClearRenderLineList();

	// [RH] Destroy any inventory this actor is carrying
	DestroyAllInventory ();

	// [RH] Unlink from tid chain
	RemoveFromHash ();

	// unlink from sector and block lists
	UnlinkFromWorld ();
	flags |= MF_NOSECTOR|MF_NOBLOCKMAP;

	// Delete all nodes on the current sector_list			phares 3/16/98
	P_DelSector_List();

	// Transform any playing sound into positioned, non-actor sounds.
	S_RelinkSound (this, NULL);

	Super::Destroy ();
}